

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O1

int SetRudderThrustersFluxPololu
              (POLOLU *pPololu,double angle,double urt,double ult,double urf,double ulf)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int pws [24];
  int selectedchannels [24];
  int local_c8 [48];
  
  local_c8[0x18] = 0;
  local_c8[0x19] = 0;
  local_c8[0x1a] = 0;
  local_c8[0x1b] = 0;
  local_c8[0x1c] = 0;
  local_c8[0x1d] = 0;
  local_c8[0x1e] = 0;
  local_c8[0x1f] = 0;
  local_c8[0x20] = 0;
  local_c8[0x21] = 0;
  local_c8[0x22] = 0;
  local_c8[0x23] = 0;
  local_c8[0x24] = 0;
  local_c8[0x25] = 0;
  local_c8[0x26] = 0;
  local_c8[0x27] = 0;
  local_c8[0x28] = 0;
  local_c8[0x29] = 0;
  local_c8[0x2a] = 0;
  local_c8[0x2b] = 0;
  local_c8[0x2c] = 0;
  local_c8[0x2d] = 0;
  local_c8[0x2e] = 0;
  local_c8[0x2f] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  local_c8[10] = 0;
  local_c8[0xb] = 0;
  local_c8[0xc] = 0;
  local_c8[0xd] = 0;
  local_c8[0xe] = 0;
  local_c8[0xf] = 0;
  local_c8[0x10] = 0;
  local_c8[0x11] = 0;
  local_c8[0x12] = 0;
  local_c8[0x13] = 0;
  local_c8[0x14] = 0;
  local_c8[0x15] = 0;
  local_c8[0x16] = 0;
  local_c8[0x17] = 0;
  dVar1 = pPololu->MidAngle;
  if (0.0 <= angle) {
    dVar10 = pPololu->MaxAngle;
    dVar8 = dVar10 - dVar1;
    dVar9 = pPololu->MinAngle;
  }
  else {
    dVar9 = pPololu->MinAngle;
    dVar10 = pPololu->MaxAngle;
    dVar8 = dVar1 - dVar9;
  }
  dVar11 = ABS(dVar9);
  if (ABS(dVar9) <= ABS(dVar10)) {
    dVar11 = ABS(dVar10);
  }
  dVar9 = ABS(pPololu->MinAngle);
  if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
    dVar9 = ABS(pPololu->MaxAngle);
  }
  local_c8[pPololu->rudderchan] =
       (int)(((dVar1 + (dVar8 * angle) / dVar11) * 500.0) / dVar9) + 0x5dc;
  lVar3 = (long)pPololu->rightthrusterchan;
  local_c8[lVar3] = (int)(urt * 1000.0 * 0.5) + 0x5dc;
  lVar4 = (long)pPololu->leftthrusterchan;
  local_c8[lVar4] = (int)(ult * 1000.0 * 0.5) + 0x5dc;
  lVar5 = (long)pPololu->rightfluxchan;
  local_c8[lVar5] = (int)(urf * 1000.0 * 0.5) + 0x5dc;
  lVar6 = (long)pPololu->leftfluxchan;
  local_c8[lVar6] = (int)(ulf * 1000.0 * 0.5) + 0x5dc;
  lVar7 = (long)pPololu->rudderchan;
  iVar2 = local_c8[lVar7];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_c8[lVar7] = iVar2;
  iVar2 = local_c8[lVar3];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_c8[lVar3] = iVar2;
  iVar2 = local_c8[lVar4];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_c8[lVar4] = iVar2;
  iVar2 = local_c8[lVar5];
  if (1999 < iVar2) {
    iVar2 = 2000;
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_c8[lVar5] = iVar2;
  iVar2 = 2000;
  if (local_c8[lVar6] < 2000) {
    iVar2 = local_c8[lVar6];
  }
  if (iVar2 < 0x3e9) {
    iVar2 = 1000;
  }
  local_c8[lVar6] = iVar2;
  local_c8[lVar7 + 0x18] = 1;
  local_c8[lVar3 + 0x18] = 1;
  local_c8[lVar4 + 0x18] = 1;
  local_c8[lVar5 + 0x18] = 1;
  local_c8[lVar6 + 0x18] = 1;
  iVar2 = SetAllPWMsPololu(pPololu,local_c8 + 0x18,local_c8);
  return iVar2;
}

Assistant:

inline int SetRudderThrustersFluxPololu(POLOLU* pPololu, double angle, double urt, double ult, double urf, double ulf)
{
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into Pololu pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pPololu->MidAngle+angle*(pPololu->MaxAngle-pPololu->MidAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)): pPololu->MidAngle+angle*(pPololu->MidAngle-pPololu->MinAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle));
	//angletmp = angle >= 0? pPololu->MidAngle+urudder*(pPololu->MaxAngle-pPololu->MidAngle): pPololu->MidAngle+urudder*(pPololu->MidAngle-pPololu->MinAngle);
	if (angletmp >= 0)
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
	else
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MID_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
#else
	pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angle*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
		/(pPololu->MaxAngle-pPololu->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into Pololu pulse width (in us).
	pws[pPololu->rightthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(urt*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(ult*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->rightfluxchan] = DEFAULT_MID_PW_POLOLU+(int)(urf*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftfluxchan] = DEFAULT_MID_PW_POLOLU+(int)(ulf*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);

	pws[pPololu->rudderchan] = max(min(pws[pPololu->rudderchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightthrusterchan] = max(min(pws[pPololu->rightthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftthrusterchan] = max(min(pws[pPololu->leftthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightfluxchan] = max(min(pws[pPololu->rightfluxchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftfluxchan] = max(min(pws[pPololu->leftfluxchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);

	selectedchannels[pPololu->rudderchan] = 1;
	selectedchannels[pPololu->rightthrusterchan] = 1;
	selectedchannels[pPololu->leftthrusterchan] = 1;
	selectedchannels[pPololu->rightfluxchan] = 1;
	selectedchannels[pPololu->leftfluxchan] = 1;

	return SetAllPWMsPololu(pPololu, selectedchannels, pws);
}